

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

char * upb_MtDataEncoder_EncodeMap
                 (upb_MtDataEncoder *e,char *ptr,upb_FieldType key_type,upb_FieldType value_type,
                 uint64_t key_mod,uint64_t value_mod)

{
  char *pcVar1;
  
  *(char **)e->internal = ptr;
  e->internal[8] = '\0';
  e->internal[9] = '\0';
  e->internal[10] = '\0';
  e->internal[0xb] = '\0';
  e->internal[0xc] = '\0';
  e->internal[0xd] = '\0';
  e->internal[0xe] = '\0';
  e->internal[0xf] = '\0';
  e->internal[0x10] = '\0';
  e->internal[0x11] = '\0';
  e->internal[0x12] = '\0';
  e->internal[0x13] = '\0';
  e->internal[0x14] = '\0';
  e->internal[0x15] = '\0';
  e->internal[0x16] = '\0';
  e->internal[0x17] = '\0';
  pcVar1 = upb_MtDataEncoder_PutRaw(e,ptr,'%');
  if (pcVar1 != (char *)0x0) {
    pcVar1 = upb_MtDataEncoder_PutField(e,pcVar1,key_type,1,key_mod);
    if (pcVar1 != (char *)0x0) {
      pcVar1 = upb_MtDataEncoder_PutField(e,pcVar1,value_type,2,value_mod);
      return pcVar1;
    }
  }
  return (char *)0x0;
}

Assistant:

char* upb_MtDataEncoder_EncodeMap(upb_MtDataEncoder* e, char* ptr,
                                  upb_FieldType key_type,
                                  upb_FieldType value_type, uint64_t key_mod,
                                  uint64_t value_mod) {
  upb_MtDataEncoderInternal* in = upb_MtDataEncoder_GetInternal(e, ptr);
  in->state.msg_state.msg_modifiers = 0;
  in->state.msg_state.last_field_num = 0;
  in->state.msg_state.oneof_state = kUpb_OneofState_NotStarted;

  ptr = upb_MtDataEncoder_PutRaw(e, ptr, kUpb_EncodedVersion_MapV1);
  if (!ptr) return NULL;

  ptr = upb_MtDataEncoder_PutField(e, ptr, key_type, 1, key_mod);
  if (!ptr) return NULL;

  return upb_MtDataEncoder_PutField(e, ptr, value_type, 2, value_mod);
}